

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::LowerReinterpretPrimitive(Lowerer *this,Instr *instr)

{
  IRType IVar1;
  Opnd *this_00;
  Opnd *this_01;
  code *pcVar2;
  bool bVar3;
  JITTimeFunctionBody *this_02;
  undefined4 *puVar4;
  
  this_02 = Func::GetJITFunctionBody(this->m_func);
  bVar3 = JITTimeFunctionBody::IsWasmFunction(this_02);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x529c,"(m_func->GetJITFunctionBody()->IsWasmFunction())",
                       "m_func->GetJITFunctionBody()->IsWasmFunction()");
    if (!bVar3) goto LAB_0054a2c1;
    *puVar4 = 0;
  }
  this_00 = instr->m_dst;
  this_01 = instr->m_src1;
  IVar1 = this_00->m_type;
  if (TySize[IVar1] != TySize[this_01->m_type]) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x52a0,"(dst->GetSize() == src1->GetSize())",
                       "dst->GetSize() == src1->GetSize()");
    if (!bVar3) goto LAB_0054a2c1;
    *puVar4 = 0;
    IVar1 = this_00->m_type;
  }
  if (IVar1 == TyInt32) {
    if (this_01->m_type == TyFloat32) goto LAB_0054a296;
  }
  else if ((IVar1 == TyFloat32) && (this_01->m_type == TyInt32)) goto LAB_0054a296;
  bVar3 = IR::Opnd::IsInt64(this_00);
  if (((!bVar3) || (this_01->m_type != TyFloat64)) &&
     ((this_00->m_type != TyFloat64 || (bVar3 = IR::Opnd::IsInt64(this_01), !bVar3)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x52a4,
                       "((dst->IsFloat32() && src1->IsInt32()) || (dst->IsInt32() && src1->IsFloat32()) || (dst->IsInt64() && src1->IsFloat64()) || (dst->IsFloat64() && src1->IsInt64()))"
                       ,
                       "(dst->IsFloat32() && src1->IsInt32()) || (dst->IsInt32() && src1->IsFloat32()) || (dst->IsInt64() && src1->IsFloat64()) || (dst->IsFloat64() && src1->IsInt64())"
                      );
    if (!bVar3) {
LAB_0054a2c1:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
LAB_0054a296:
  LowererMD::EmitReinterpretPrimitive(&this->m_lowererMD,this_00,this_01,instr);
  IR::Instr::Remove(instr);
  return;
}

Assistant:

void
Lowerer::LowerReinterpretPrimitive(IR::Instr* instr)
{
    Assert(m_func->GetJITFunctionBody()->IsWasmFunction());
    IR::Opnd* src1 = instr->GetSrc1();
    IR::Opnd* dst =  instr->GetDst();

    Assert(dst->GetSize() == src1->GetSize());
    Assert((dst->IsFloat32() && src1->IsInt32()) ||
           (dst->IsInt32() && src1->IsFloat32()) ||
           (dst->IsInt64() && src1->IsFloat64()) ||
           (dst->IsFloat64() && src1->IsInt64()) );

    m_lowererMD.EmitReinterpretPrimitive(dst, src1, instr);
    instr->Remove();
}